

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O3

bool __thiscall
Js::ES5Array::GetSetterBuiltIns
          (ES5Array *this,PropertyId propertyId,PropertyValueInfo *info,DescriptorFlags *result)

{
  uint uVar1;
  DynamicTypeHandler *pDVar2;
  
  if (propertyId == 0xd1) {
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
    pDVar2 = DynamicObject::GetTypeHandler((DynamicObject *)this);
    uVar1 = (*pDVar2->_vptr_DynamicTypeHandler[0x41])(pDVar2);
    *result = (uVar1 & 0xff) * 4 + Data;
  }
  return propertyId == 0xd1;
}

Assistant:

bool ES5Array::GetSetterBuiltIns(PropertyId propertyId, PropertyValueInfo* info, DescriptorFlags* result)
    {
        if (propertyId == PropertyIds::length)
        {
            PropertyValueInfo::SetNoCache(info, this);
            *result =  IsLengthWritable() ? WritableData : Data;
            return true;
        }

        return false;
    }